

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_FakeMessageSet_Item_UnknownGroup *
upb_test_FakeMessageSet_Item_mutable_unknowngroup
          (upb_test_FakeMessageSet_Item *msg,upb_Arena *arena)

{
  upb_test_FakeMessageSet_Item_UnknownGroup *value;
  
  value = upb_test_FakeMessageSet_Item_unknowngroup(msg);
  if (value == (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0) {
    value = (upb_test_FakeMessageSet_Item_UnknownGroup *)
            _upb_Message_New(&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init,arena);
    if (value == (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0) {
      value = (upb_test_FakeMessageSet_Item_UnknownGroup *)0x0;
    }
    else {
      upb_test_FakeMessageSet_Item_set_unknowngroup(msg,value);
    }
  }
  return value;
}

Assistant:

UPB_INLINE struct upb_test_FakeMessageSet_Item_UnknownGroup* upb_test_FakeMessageSet_Item_mutable_unknowngroup(upb_test_FakeMessageSet_Item* msg, upb_Arena* arena) {
  struct upb_test_FakeMessageSet_Item_UnknownGroup* sub = (struct upb_test_FakeMessageSet_Item_UnknownGroup*)upb_test_FakeMessageSet_Item_unknowngroup(msg);
  if (sub == NULL) {
    sub = (struct upb_test_FakeMessageSet_Item_UnknownGroup*)_upb_Message_New(&upb_0test__FakeMessageSet__Item__UnknownGroup_msg_init, arena);
    if (sub) upb_test_FakeMessageSet_Item_set_unknowngroup(msg, sub);
  }
  return sub;
}